

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

bool __thiscall soul::AST::StructDeclaration::isResolved(StructDeclaration *this)

{
  size_t sVar1;
  Member *pMVar2;
  int iVar3;
  Expression *pEVar4;
  long lVar5;
  bool bVar6;
  
  if (this->isBeingResolved == false) {
    this->isBeingResolved = true;
    sVar1 = (this->members).numActive;
    bVar6 = sVar1 == 0;
    if (!bVar6) {
      pMVar2 = (this->members).items;
      pEVar4 = (pMVar2->type).object;
      if (pEVar4->kind == type) {
        lVar5 = 0x28;
        do {
          iVar3 = (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[3])();
          if (((char)iVar3 == '\0') || (bVar6 = sVar1 * 0x28 == lVar5, bVar6)) break;
          pEVar4 = *(Expression **)((long)&(pMVar2->type).object + lVar5);
          lVar5 = lVar5 + 0x28;
        } while (pEVar4->kind == type);
      }
    }
    this->isBeingResolved = false;
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool isResolved() const override
        {
            if (isBeingResolved)
                return false;

            ScopedResolver scopedResolver (isBeingResolved);

            for (auto& m : members)
                if (! isResolvedAsType (m.type.get()))
                    return false;

            return true;
        }